

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O0

int __thiscall zmq::radio_session_t::push_msg(radio_session_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  msg_t *in_RSI;
  char *in_RDI;
  char *errstr_2;
  char *errstr_1;
  char *errstr;
  int rc;
  msg_t join_leave_msg;
  char *group;
  int group_length;
  size_t data_size;
  char *command_data;
  size_t in_stack_ffffffffffffff58;
  msg_t *in_stack_ffffffffffffff68;
  msg_t *in_stack_ffffffffffffff70;
  session_base_t *in_stack_ffffffffffffff78;
  int local_7c;
  msg_t local_78;
  long local_38;
  int local_2c;
  size_t local_28;
  void *local_20;
  msg_t *local_18;
  int local_4;
  
  local_18 = in_RSI;
  bVar1 = msg_t::flags(in_RSI);
  if ((bVar1 & 2) == 0) {
    local_4 = session_base_t::push_msg(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else {
    local_20 = msg_t::data(in_stack_ffffffffffffff68);
    local_28 = msg_t::size(in_stack_ffffffffffffff68);
    if ((local_28 < 5) || (iVar2 = memcmp(local_20,"\x04JOIN",5), iVar2 != 0)) {
      if ((local_28 < 6) || (iVar2 = memcmp(local_20,"\x05LEAVE",6), iVar2 != 0)) {
        iVar2 = session_base_t::push_msg(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        return iVar2;
      }
      local_2c = (int)local_28 + -6;
      local_38 = (long)local_20 + 6;
      local_7c = msg_t::init_leave(&local_78);
    }
    else {
      local_2c = (int)local_28 + -5;
      local_38 = (long)local_20 + 5;
      local_7c = msg_t::init_join(&local_78);
    }
    if (local_7c != 0) {
      piVar4 = __errno_location();
      in_stack_ffffffffffffff78 = (session_base_t *)strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff78,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
              ,0xf0);
      fflush(_stderr);
      zmq_abort((char *)0x2ecd02);
    }
    iVar2 = (int)local_38;
    iVar3 = msg_t::set_group(in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      in_stack_ffffffffffffff70 = (msg_t *)strerror(*piVar4);
      iVar2 = 0x32b5b5;
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff70,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
              ,0xf4);
      fflush(_stderr);
      zmq_abort((char *)0x2ecd80);
    }
    iVar2 = msg_t::close(local_18,iVar2);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
              ,0xf8);
      fflush(_stderr);
      zmq_abort((char *)0x2ecdf7);
    }
    memcpy(local_18,&local_78,0x40);
    local_4 = session_base_t::push_msg(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  return local_4;
}

Assistant:

int zmq::radio_session_t::push_msg (msg_t *msg_)
{
    if (msg_->flags () & msg_t::command) {
        char *command_data = static_cast<char *> (msg_->data ());
        const size_t data_size = msg_->size ();

        int group_length;
        const char *group;

        msg_t join_leave_msg;
        int rc;

        //  Set the msg type to either JOIN or LEAVE
        if (data_size >= 5 && memcmp (command_data, "\4JOIN", 5) == 0) {
            group_length = static_cast<int> (data_size) - 5;
            group = command_data + 5;
            rc = join_leave_msg.init_join ();
        } else if (data_size >= 6 && memcmp (command_data, "\5LEAVE", 6) == 0) {
            group_length = static_cast<int> (data_size) - 6;
            group = command_data + 6;
            rc = join_leave_msg.init_leave ();
        }
        //  If it is not a JOIN or LEAVE just push the message
        else
            return session_base_t::push_msg (msg_);

        errno_assert (rc == 0);

        //  Set the group
        rc = join_leave_msg.set_group (group, group_length);
        errno_assert (rc == 0);

        //  Close the current command
        rc = msg_->close ();
        errno_assert (rc == 0);

        //  Push the join or leave command
        *msg_ = join_leave_msg;
        return session_base_t::push_msg (msg_);
    }
    return session_base_t::push_msg (msg_);
}